

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O1

void __thiscall tetgenmesh::freememory(tetgenmesh *this)

{
  tetgenmesh *this_00;
  memorypool *pmVar1;
  arraypool *paVar2;
  double dVar3;
  void **ppvVar4;
  
  this_00 = this->bgm;
  if (this_00 != (tetgenmesh *)0x0) {
    freememory(this_00);
    operator_delete(this_00,0x600);
  }
  pmVar1 = this->points;
  if (pmVar1 != (memorypool *)0x0) {
    ppvVar4 = pmVar1->firstblock;
    while (ppvVar4 != (void **)0x0) {
      pmVar1->nowblock = (void **)*ppvVar4;
      free(ppvVar4);
      ppvVar4 = pmVar1->nowblock;
      pmVar1->firstblock = ppvVar4;
    }
    operator_delete(pmVar1,0x58);
    if (this->dummypoint != (point)0x0) {
      operator_delete__(this->dummypoint);
    }
  }
  pmVar1 = this->tetrahedrons;
  if (pmVar1 != (memorypool *)0x0) {
    ppvVar4 = pmVar1->firstblock;
    while (ppvVar4 != (void **)0x0) {
      pmVar1->nowblock = (void **)*ppvVar4;
      free(ppvVar4);
      ppvVar4 = pmVar1->nowblock;
      pmVar1->firstblock = ppvVar4;
    }
    operator_delete(pmVar1,0x58);
  }
  pmVar1 = this->subfaces;
  if (pmVar1 != (memorypool *)0x0) {
    ppvVar4 = pmVar1->firstblock;
    while (ppvVar4 != (void **)0x0) {
      pmVar1->nowblock = (void **)*ppvVar4;
      free(ppvVar4);
      ppvVar4 = pmVar1->nowblock;
      pmVar1->firstblock = ppvVar4;
    }
    operator_delete(pmVar1,0x58);
    pmVar1 = this->subsegs;
    if (pmVar1 != (memorypool *)0x0) {
      ppvVar4 = pmVar1->firstblock;
      while (ppvVar4 != (void **)0x0) {
        pmVar1->nowblock = (void **)*ppvVar4;
        free(ppvVar4);
        ppvVar4 = pmVar1->nowblock;
        pmVar1->firstblock = ppvVar4;
      }
      operator_delete(pmVar1,0x58);
    }
  }
  pmVar1 = this->tet2segpool;
  if (pmVar1 != (memorypool *)0x0) {
    ppvVar4 = pmVar1->firstblock;
    while (ppvVar4 != (void **)0x0) {
      pmVar1->nowblock = (void **)*ppvVar4;
      free(ppvVar4);
      ppvVar4 = pmVar1->nowblock;
      pmVar1->firstblock = ppvVar4;
    }
    operator_delete(pmVar1,0x58);
    pmVar1 = this->tet2subpool;
    if (pmVar1 != (memorypool *)0x0) {
      ppvVar4 = pmVar1->firstblock;
      while (ppvVar4 != (void **)0x0) {
        pmVar1->nowblock = (void **)*ppvVar4;
        free(ppvVar4);
        ppvVar4 = pmVar1->nowblock;
        pmVar1->firstblock = ppvVar4;
      }
      operator_delete(pmVar1,0x58);
    }
  }
  pmVar1 = this->badtetrahedrons;
  if (pmVar1 != (memorypool *)0x0) {
    ppvVar4 = pmVar1->firstblock;
    while (ppvVar4 != (void **)0x0) {
      pmVar1->nowblock = (void **)*ppvVar4;
      free(ppvVar4);
      ppvVar4 = pmVar1->nowblock;
      pmVar1->firstblock = ppvVar4;
    }
    operator_delete(pmVar1,0x58);
  }
  pmVar1 = this->badsubfacs;
  if (pmVar1 != (memorypool *)0x0) {
    ppvVar4 = pmVar1->firstblock;
    while (ppvVar4 != (void **)0x0) {
      pmVar1->nowblock = (void **)*ppvVar4;
      free(ppvVar4);
      ppvVar4 = pmVar1->nowblock;
      pmVar1->firstblock = ppvVar4;
    }
    operator_delete(pmVar1,0x58);
  }
  pmVar1 = this->badsubsegs;
  if (pmVar1 != (memorypool *)0x0) {
    ppvVar4 = pmVar1->firstblock;
    while (ppvVar4 != (void **)0x0) {
      pmVar1->nowblock = (void **)*ppvVar4;
      free(ppvVar4);
      ppvVar4 = pmVar1->nowblock;
      pmVar1->firstblock = ppvVar4;
    }
    operator_delete(pmVar1,0x58);
  }
  paVar2 = this->encseglist;
  if (paVar2 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar2);
    operator_delete(paVar2,0x30);
  }
  paVar2 = this->encshlist;
  if (paVar2 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar2);
    operator_delete(paVar2,0x30);
  }
  pmVar1 = this->flippool;
  if (pmVar1 != (memorypool *)0x0) {
    ppvVar4 = pmVar1->firstblock;
    while (ppvVar4 != (void **)0x0) {
      pmVar1->nowblock = (void **)*ppvVar4;
      free(ppvVar4);
      ppvVar4 = pmVar1->nowblock;
      pmVar1->firstblock = ppvVar4;
    }
    operator_delete(pmVar1,0x58);
    paVar2 = this->unflipqueue;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
      operator_delete(paVar2,0x30);
    }
  }
  paVar2 = this->cavetetlist;
  if (paVar2 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar2);
    operator_delete(paVar2,0x30);
    paVar2 = this->cavebdrylist;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
      operator_delete(paVar2,0x30);
    }
    paVar2 = this->caveoldtetlist;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
      operator_delete(paVar2,0x30);
    }
    paVar2 = this->cavetetvertlist;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
      operator_delete(paVar2,0x30);
    }
  }
  paVar2 = this->caveshlist;
  if (paVar2 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar2);
    operator_delete(paVar2,0x30);
    paVar2 = this->caveshbdlist;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
      operator_delete(paVar2,0x30);
    }
    paVar2 = this->cavesegshlist;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
      operator_delete(paVar2,0x30);
    }
    paVar2 = this->cavetetshlist;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
      operator_delete(paVar2,0x30);
    }
    paVar2 = this->cavetetseglist;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
      operator_delete(paVar2,0x30);
    }
    paVar2 = this->caveencshlist;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
      operator_delete(paVar2,0x30);
    }
    paVar2 = this->caveencseglist;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
      operator_delete(paVar2,0x30);
    }
  }
  paVar2 = this->subsegstack;
  if (paVar2 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar2);
    operator_delete(paVar2,0x30);
    paVar2 = this->subfacstack;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
      operator_delete(paVar2,0x30);
    }
    paVar2 = this->subvertstack;
    if (paVar2 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar2);
      operator_delete(paVar2,0x30);
    }
  }
  if (this->idx2facetlist != (int *)0x0) {
    operator_delete__(this->idx2facetlist);
    if (this->facetverticeslist != (point *)0x0) {
      operator_delete__(this->facetverticeslist);
    }
  }
  if (this->segmentendpointslist != (point *)0x0) {
    operator_delete__(this->segmentendpointslist);
  }
  if (this->highordertable != (point *)0x0) {
    operator_delete__(this->highordertable);
  }
  memset(this,0,0x120);
  this->highordertable = (point *)0x0;
  this->numpointattrib = 0;
  this->numelemattrib = 0;
  this->sizeoftensor = 0;
  this->pointmtrindex = 0;
  this->pointparamindex = 0;
  this->point2simindex = 0;
  this->pointmarkindex = 0;
  this->pointinsradiusindex = 0;
  this->elemattribindex = 0;
  this->volumeboundindex = 0;
  this->shmarkindex = 0;
  this->areaboundindex = 0;
  this->checksubsegflag = 0;
  this->checksubfaceflag = 0;
  this->checkconstraints = 0;
  this->nonconvex = 0;
  this->autofliplinklevel = 1;
  this->useinsertradius = 0;
  this->samples = 0;
  this->randomseed = 1;
  dVar3 = PI;
  this->minfacetdihed = PI;
  this->minfaceang = dVar3;
  this->meshhulledges = 0;
  this->hullsize = 0;
  this->meshedges = 0;
  this->zmin = 0.0;
  this->insegments = 0;
  this->ymin = 0.0;
  this->zmax = 0.0;
  this->xmin = 0.0;
  this->ymax = 0.0;
  this->minedgelength = 0.0;
  this->xmax = 0.0;
  this->tetprism_vol_sum = 0.0;
  this->longest = 0.0;
  this->steinerleft = -1;
  memset(&this->dupverts,0,0x98);
  return;
}

Assistant:

void freememory()
  {
    if (bgm != NULL) {
      delete bgm;
    }

    if (points != (memorypool *) NULL) {
      delete points;
      delete [] dummypoint;
    }
    if (tetrahedrons != (memorypool *) NULL) {
      delete tetrahedrons;
    }
    if (subfaces != (memorypool *) NULL) {
      delete subfaces;
      delete subsegs;
    }
    if (tet2segpool != NULL) {
      delete tet2segpool;
      delete tet2subpool;
    }

    if (badtetrahedrons) {
      delete badtetrahedrons;
    }
    if (badsubfacs) {
      delete badsubfacs;
    }
    if (badsubsegs) {
      delete badsubsegs;
    }
    if (encseglist) {
      delete encseglist;
    }
    if (encshlist) {
      delete encshlist;
    }

    if (flippool != NULL) {
      delete flippool;
      delete unflipqueue;
    }

    if (cavetetlist != NULL) {
      delete cavetetlist;
      delete cavebdrylist;
      delete caveoldtetlist;
      delete cavetetvertlist;
    }

    if (caveshlist != NULL) {
      delete caveshlist;
      delete caveshbdlist;
      delete cavesegshlist;
      delete cavetetshlist;
      delete cavetetseglist;
      delete caveencshlist;
      delete caveencseglist;
    }

    if (subsegstack != NULL) {
      delete subsegstack;
      delete subfacstack;
      delete subvertstack;
    }

    if (idx2facetlist != NULL) {
      delete [] idx2facetlist;
      delete [] facetverticeslist;
    }

    if (segmentendpointslist != NULL) {
      delete [] segmentendpointslist;
    }

    if (highordertable != NULL) {
      delete [] highordertable;
    }

    initializetetgenmesh();
  }